

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

char * encode_uint32(uint32_t i,char *p)

{
  int8_t iVar1;
  char *p_local;
  uint32_t i_local;
  
  iVar1 = is_little_endian();
  if (iVar1 == '\0') {
    big_endian_to_little(i,p);
  }
  else {
    *(uint32_t *)p = i;
  }
  return p + 4;
}

Assistant:

char *encode_uint32(uint32_t i, char *p) {
    if (is_little_endian()) {
        *(uint32_t *) p = i;
    } else {
        // convert to little endian.
        big_endian_to_little(i, p);
    }
    return p + 4;
}